

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# snapshot.cpp
# Opt level: O0

int __thiscall
CSnapshotDelta::CreateDelta(CSnapshotDelta *this,CSnapshot *pFrom,CSnapshot *pTo,void *pDstData)

{
  undefined1 *puVar1;
  int iVar2;
  CSnapshotItem *pCVar3;
  int *piVar4;
  undefined1 *puVar5;
  long in_FS_OFFSET;
  int *pItemDataDst;
  bool IncludeSize;
  int NumItems;
  int SizeCount;
  CSnapshotItem *pPastItem;
  CSnapshotItem *pCurItem;
  CSnapshotItem *pFromItem;
  int PastIndex;
  int ItemSize;
  int i;
  int *pData;
  CData *pDelta;
  void *pDstData_local;
  CSnapshot *pTo_local;
  CSnapshot *pFrom_local;
  CSnapshotDelta *this_local;
  int aPastIndecies [1024];
  CItemList Hashlist [256];
  
  puVar1 = (undefined1 *)register0x00000020;
  do {
    puVar5 = puVar1;
    *(undefined8 *)(puVar5 + -0x1000) = 0;
    puVar1 = puVar5 + -0x1000;
  } while ((int *)(puVar5 + -0x1000) != aPastIndecies + 0x102);
  *(undefined8 *)(puVar5 + 0x1fff8) = *(undefined8 *)(in_FS_OFFSET + 0x28);
  *(CSnapshotDelta **)(puVar5 + -0x1418) = this;
  *(CSnapshot **)(puVar5 + -0x1420) = pFrom;
  *(CSnapshot **)(puVar5 + -0x1428) = pTo;
  *(void **)(puVar5 + -0x1430) = pDstData;
  *(undefined8 *)(puVar5 + -0x1488) = *(undefined8 *)(puVar5 + -0x1418);
  *(undefined8 *)(puVar5 + -0x1438) = *(undefined8 *)(puVar5 + -0x1430);
  *(long *)(puVar5 + -0x1440) = *(long *)(puVar5 + -0x1438) + 0xc;
  *(undefined4 *)(puVar5 + -0x146c) = 0;
  **(undefined4 **)(puVar5 + -0x1438) = 0;
  *(undefined4 *)(*(long *)(puVar5 + -0x1438) + 4) = 0;
  *(undefined4 *)(*(long *)(puVar5 + -0x1438) + 8) = 0;
  *(undefined8 *)(puVar5 + -0x14c0) = 0x24bd21;
  GenerateHash(*(CItemList **)(puVar5 + -0x14a0),*(CSnapshot **)(puVar5 + -0x14a8));
  *(undefined4 *)(puVar5 + -0x1444) = 0;
  while( true ) {
    *(undefined4 *)(puVar5 + -0x148c) = *(undefined4 *)(puVar5 + -0x1444);
    *(undefined8 *)(puVar5 + -0x14c0) = 0x24bd3e;
    iVar2 = CSnapshot::NumItems(*(CSnapshot **)(puVar5 + -0x1420));
    if (iVar2 <= *(int *)(puVar5 + -0x148c)) break;
    *(undefined8 *)(puVar5 + -0x14c0) = 0x24bd59;
    pCVar3 = CSnapshot::GetItem(*(CSnapshot **)(puVar5 + -0x14a0),*(int *)(puVar5 + -0x14a4));
    *(CSnapshotItem **)(puVar5 + -0x1458) = pCVar3;
    *(undefined8 *)(puVar5 + -0x14c0) = 0x24bd68;
    iVar2 = CSnapshotItem::Key(*(CSnapshotItem **)(puVar5 + -0x1458));
    *(undefined8 *)(puVar5 + -0x14c0) = 0x24bd77;
    iVar2 = GetItemIndexHashed(iVar2,(CItemList *)(puVar5 + -0x408));
    if (iVar2 == -1) {
      **(int **)(puVar5 + -0x1438) = **(int **)(puVar5 + -0x1438) + 1;
      *(undefined8 *)(puVar5 + -0x14c0) = 0x24bd95;
      iVar2 = CSnapshotItem::Key(*(CSnapshotItem **)(puVar5 + -0x1458));
      **(int **)(puVar5 + -0x1440) = iVar2;
      *(long *)(puVar5 + -0x1440) = *(long *)(puVar5 + -0x1440) + 4;
    }
    *(int *)(puVar5 + -0x1444) = *(int *)(puVar5 + -0x1444) + 1;
  }
  *(undefined8 *)(puVar5 + -0x14c0) = 0x24bdd3;
  GenerateHash(*(CItemList **)(puVar5 + -0x14a0),*(CSnapshot **)(puVar5 + -0x14a8));
  *(undefined8 *)(puVar5 + -0x14c0) = 0x24bde0;
  iVar2 = CSnapshot::NumItems(*(CSnapshot **)(puVar5 + -0x1428));
  *(int *)(puVar5 + -0x1470) = iVar2;
  *(undefined4 *)(puVar5 + -0x1444) = 0;
  while (*(int *)(puVar5 + -0x1444) < *(int *)(puVar5 + -0x1470)) {
    *(undefined8 *)(puVar5 + -0x14c0) = 0x24be07;
    pCVar3 = CSnapshot::GetItem(*(CSnapshot **)(puVar5 + -0x14a0),*(int *)(puVar5 + -0x14a4));
    *(CSnapshotItem **)(puVar5 + -0x1460) = pCVar3;
    *(undefined8 *)(puVar5 + -0x14c0) = 0x24be16;
    iVar2 = CSnapshotItem::Key(*(CSnapshotItem **)(puVar5 + -0x1460));
    *(undefined8 *)(puVar5 + -0x14c0) = 0x24be25;
    iVar2 = GetItemIndexHashed(iVar2,(CItemList *)(puVar5 + -0x408));
    *(int *)(puVar5 + (long)*(int *)(puVar5 + -0x1444) * 4 + -0x1408) = iVar2;
    *(int *)(puVar5 + -0x1444) = *(int *)(puVar5 + -0x1444) + 1;
  }
  *(undefined4 *)(puVar5 + -0x1444) = 0;
  while (*(int *)(puVar5 + -0x1444) < *(int *)(puVar5 + -0x1470)) {
    *(undefined8 *)(puVar5 + -0x14c0) = 0x24be67;
    iVar2 = CSnapshot::GetItemSize(*(CSnapshot **)(puVar5 + -0x14a8),*(int *)(puVar5 + -0x14ac));
    *(int *)(puVar5 + -0x1448) = iVar2;
    *(undefined8 *)(puVar5 + -0x14c0) = 0x24be7c;
    pCVar3 = CSnapshot::GetItem(*(CSnapshot **)(puVar5 + -0x14a0),*(int *)(puVar5 + -0x14a4));
    *(CSnapshotItem **)(puVar5 + -0x1460) = pCVar3;
    *(undefined4 *)(puVar5 + -0x144c) =
         *(undefined4 *)(puVar5 + (long)*(int *)(puVar5 + -0x1444) * 4 + -0x1408);
    *(undefined8 *)(puVar5 + -0x14c0) = 0x24be9b;
    iVar2 = CSnapshotItem::Type(*(CSnapshotItem **)(puVar5 + -0x1460));
    puVar5[-0x148d] = 1;
    if (iVar2 < 0x40) {
      *(undefined8 *)(puVar5 + -0x14c0) = 0x24beb2;
      iVar2 = CSnapshotItem::Type(*(CSnapshotItem **)(puVar5 + -0x1460));
      puVar5[-0x148d] = *(short *)(*(long *)(puVar5 + -0x1488) + (long)iVar2 * 2) != 0 ^ 0xff;
    }
    puVar5[-0x1471] = puVar5[-0x148d] & 1;
    if (*(int *)(puVar5 + -0x144c) == -1) {
      *(undefined8 *)(puVar5 + -0x14c0) = 0x24c00c;
      iVar2 = CSnapshotItem::Type(*(CSnapshotItem **)(puVar5 + -0x1460));
      piVar4 = *(int **)(puVar5 + -0x1440);
      *(int **)(puVar5 + -0x1440) = piVar4 + 1;
      *piVar4 = iVar2;
      *(undefined8 *)(puVar5 + -0x14c0) = 0x24c02b;
      iVar2 = CSnapshotItem::ID(*(CSnapshotItem **)(puVar5 + -0x1460));
      piVar4 = *(int **)(puVar5 + -0x1440);
      *(int **)(puVar5 + -0x1440) = piVar4 + 1;
      *piVar4 = iVar2;
      if ((puVar5[-0x1471] & 1) != 0) {
        piVar4 = *(int **)(puVar5 + -0x1440);
        *(int **)(puVar5 + -0x1440) = piVar4 + 1;
        *piVar4 = *(int *)(puVar5 + -0x1448) / 4;
      }
      *(undefined8 *)(puVar5 + -0x14a8) = *(undefined8 *)(puVar5 + -0x1440);
      *(undefined8 *)(puVar5 + -0x14c0) = 0x24c07c;
      CSnapshotItem::Data(*(CSnapshotItem **)(puVar5 + -0x1460));
      *(undefined8 *)(puVar5 + -0x14c0) = 0x24c08d;
      mem_copy(*(void **)(puVar5 + -0x14b0),*(void **)(puVar5 + -0x14b8),*(uint *)(puVar5 + -0x14bc)
              );
      *(int *)(puVar5 + -0x146c) = *(int *)(puVar5 + -0x1448) + *(int *)(puVar5 + -0x146c);
      *(long *)(puVar5 + -0x1440) =
           *(long *)(puVar5 + -0x1440) + (long)(*(int *)(puVar5 + -0x1448) / 4) * 4;
      *(int *)(*(long *)(puVar5 + -0x1438) + 4) = *(int *)(*(long *)(puVar5 + -0x1438) + 4) + 1;
    }
    else {
      *(long *)(puVar5 + -0x1480) = *(long *)(puVar5 + -0x1440) + 0xc;
      *(undefined8 *)(puVar5 + -0x14c0) = 0x24befe;
      pCVar3 = CSnapshot::GetItem(*(CSnapshot **)(puVar5 + -0x14a0),*(int *)(puVar5 + -0x14a4));
      *(CSnapshotItem **)(puVar5 + -0x1468) = pCVar3;
      if ((puVar5[-0x1471] & 1) == 0) {
        *(long *)(puVar5 + -0x1480) = *(long *)(puVar5 + -0x1440) + 8;
      }
      *(undefined8 *)(puVar5 + -0x14c0) = 0x24bf22;
      piVar4 = CSnapshotItem::Data(*(CSnapshotItem **)(puVar5 + -0x1468));
      *(int **)(puVar5 + -0x14a0) = piVar4;
      *(undefined8 *)(puVar5 + -0x14c0) = 0x24bf31;
      piVar4 = CSnapshotItem::Data(*(CSnapshotItem **)(puVar5 + -0x1460));
      *(undefined8 *)(puVar5 + -0x1498) = *(undefined8 *)(puVar5 + -0x1480);
      *(undefined8 *)(puVar5 + -0x14c0) = 0x24bf5b;
      iVar2 = DiffItem(*(int **)(puVar5 + -0x14a0),piVar4,*(int **)(puVar5 + -0x1498),
                       *(int *)(puVar5 + -0x1448) / 4);
      if (iVar2 != 0) {
        *(undefined8 *)(puVar5 + -0x14c0) = 0x24bf6e;
        iVar2 = CSnapshotItem::Type(*(CSnapshotItem **)(puVar5 + -0x1460));
        piVar4 = *(int **)(puVar5 + -0x1440);
        *(int **)(puVar5 + -0x1440) = piVar4 + 1;
        *piVar4 = iVar2;
        *(undefined8 *)(puVar5 + -0x14c0) = 0x24bf8d;
        iVar2 = CSnapshotItem::ID(*(CSnapshotItem **)(puVar5 + -0x1460));
        piVar4 = *(int **)(puVar5 + -0x1440);
        *(int **)(puVar5 + -0x1440) = piVar4 + 1;
        *piVar4 = iVar2;
        if ((puVar5[-0x1471] & 1) != 0) {
          piVar4 = *(int **)(puVar5 + -0x1440);
          *(int **)(puVar5 + -0x1440) = piVar4 + 1;
          *piVar4 = *(int *)(puVar5 + -0x1448) / 4;
        }
        *(long *)(puVar5 + -0x1440) =
             *(long *)(puVar5 + -0x1440) + (long)(*(int *)(puVar5 + -0x1448) / 4) * 4;
        *(int *)(*(long *)(puVar5 + -0x1438) + 4) = *(int *)(*(long *)(puVar5 + -0x1438) + 4) + 1;
      }
    }
    *(int *)(puVar5 + -0x1444) = *(int *)(puVar5 + -0x1444) + 1;
  }
  if (((**(int **)(puVar5 + -0x1438) == 0) && (*(int *)(*(long *)(puVar5 + -0x1438) + 4) == 0)) &&
     (*(int *)(*(long *)(puVar5 + -0x1438) + 8) == 0)) {
    *(undefined4 *)(puVar5 + -0x140c) = 0;
  }
  else {
    *(int *)(puVar5 + -0x140c) =
         (int)*(undefined8 *)(puVar5 + -0x1440) - (int)*(undefined8 *)(puVar5 + -0x1430);
  }
  *(undefined4 *)(puVar5 + -0x14ac) = *(undefined4 *)(puVar5 + -0x140c);
  if (*(long *)(in_FS_OFFSET + 0x28) != *(long *)(puVar5 + 0x1fff8)) {
    *(undefined8 *)(puVar5 + -0x14c0) = 0x24c15d;
    __stack_chk_fail();
  }
  return *(int *)(puVar5 + -0x14ac);
}

Assistant:

int CSnapshotDelta::CreateDelta(const CSnapshot *pFrom, CSnapshot *pTo, void *pDstData)
{
	CData *pDelta = (CData *)pDstData;
	int *pData = (int *)pDelta->m_pData;
	int i, ItemSize, PastIndex;
	const CSnapshotItem *pFromItem;
	const CSnapshotItem *pCurItem;
	const CSnapshotItem *pPastItem;
	int SizeCount = 0;

	pDelta->m_NumDeletedItems = 0;
	pDelta->m_NumUpdateItems = 0;
	pDelta->m_NumTempItems = 0;

	CItemList Hashlist[HASHLIST_SIZE];
	GenerateHash(Hashlist, pTo);

	// pack deleted stuff
	for(i = 0; i < pFrom->NumItems(); i++)
	{
		pFromItem = pFrom->GetItem(i);
		if(GetItemIndexHashed(pFromItem->Key(), Hashlist) == -1)
		{
			// deleted
			pDelta->m_NumDeletedItems++;
			*pData = pFromItem->Key();
			pData++;
		}
	}

	GenerateHash(Hashlist, pFrom);
	int aPastIndecies[1024];

	// fetch previous indices
	// we do this as a separate pass because it helps the cache
	const int NumItems = pTo->NumItems();
	for(i = 0; i < NumItems; i++)
	{
		pCurItem = pTo->GetItem(i); // O(1) .. O(n)
		aPastIndecies[i] = GetItemIndexHashed(pCurItem->Key(), Hashlist); // O(n) .. O(n^n)
	}

	for(i = 0; i < NumItems; i++)
	{
		// do delta
		ItemSize = pTo->GetItemSize(i); // O(1) .. O(n)
		pCurItem = pTo->GetItem(i); // O(1) .. O(n)
		PastIndex = aPastIndecies[i];

		bool IncludeSize = pCurItem->Type() >= MAX_NETOBJSIZES || !m_aItemSizes[pCurItem->Type()];

		if(PastIndex != -1)
		{
			int *pItemDataDst = pData+3;

			pPastItem = pFrom->GetItem(PastIndex);

			if(!IncludeSize)
				pItemDataDst = pData+2;

			if(DiffItem(pPastItem->Data(), (int*)pCurItem->Data(), pItemDataDst, ItemSize/4))
			{

				*pData++ = pCurItem->Type();
				*pData++ = pCurItem->ID();
				if(IncludeSize)
					*pData++ = ItemSize/4;
				pData += ItemSize/4;
				pDelta->m_NumUpdateItems++;
			}
		}
		else
		{
			*pData++ = pCurItem->Type();
			*pData++ = pCurItem->ID();
			if(IncludeSize)
				*pData++ = ItemSize/4;

			mem_copy(pData, pCurItem->Data(), ItemSize);
			SizeCount += ItemSize;
			pData += ItemSize/4;
			pDelta->m_NumUpdateItems++;
		}
	}

	if(0)
	{
		dbg_msg("snapshot", "%d %d %d",
			pDelta->m_NumDeletedItems,
			pDelta->m_NumUpdateItems,
			pDelta->m_NumTempItems);
	}

	/*
	// TODO: pack temp stuff

	// finish
	//mem_copy(pDelta->offsets, deleted, pDelta->num_deleted_items*sizeof(int));
	//mem_copy(&(pDelta->offsets[pDelta->num_deleted_items]), update, pDelta->num_update_items*sizeof(int));
	//mem_copy(&(pDelta->offsets[pDelta->num_deleted_items+pDelta->num_update_items]), temp, pDelta->num_temp_items*sizeof(int));
	//mem_copy(pDelta->data_start(), data, data_size);
	//pDelta->data_size = data_size;
	* */

	if(!pDelta->m_NumDeletedItems && !pDelta->m_NumUpdateItems && !pDelta->m_NumTempItems)
		return 0;

	return (int)((char*)pData-(char*)pDstData);
}